

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BraIA64.c
# Opt level: O2

SizeT IA64_Convert(Byte *data,SizeT size,UInt32 ip,int encoding)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  byte *pbVar4;
  SizeT SVar5;
  byte bVar6;
  uint uVar7;
  long lVar8;
  byte *pbVar9;
  Byte *pBVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  
  if (size < 0x10) {
    SVar5 = 0;
  }
  else {
    pBVar10 = data;
    for (SVar5 = 0; SVar5 <= size - 0x10; SVar5 = SVar5 + 0x10) {
      uVar7 = ip + (int)SVar5;
      uVar2 = -uVar7;
      if (encoding != 0) {
        uVar2 = uVar7;
      }
      bVar1 = ""[data[SVar5] & 0x1f];
      uVar12 = 5;
      for (uVar7 = 0; uVar7 != 3; uVar7 = uVar7 + 1) {
        if ((bVar1 >> (uVar7 & 0x1f) & 1) != 0) {
          pbVar9 = pBVar10 + (uVar12 >> 3);
          uVar11 = 0;
          pbVar4 = pbVar9;
          for (lVar8 = 0; lVar8 != 0x30; lVar8 = lVar8 + 8) {
            uVar11 = uVar11 + ((ulong)*pbVar4 << ((byte)lVar8 & 0x3f));
            pbVar4 = pbVar4 + 1;
          }
          bVar6 = (byte)uVar12 & 7;
          uVar13 = uVar11 >> bVar6;
          if ((uVar13 & 0x1e000000e00) == 0xa000000000) {
            uVar3 = ((uint)(uVar13 >> 0x10) & 0x100000 | (uint)(uVar13 >> 0xd) & 0xfffff) +
                    (uVar2 >> 4);
            for (lVar8 = 0; lVar8 != 0x30; lVar8 = lVar8 + 8) {
              *pbVar9 = (byte)((((ulong)(uVar3 & 0x100000) << 0x10 |
                                (ulong)(uVar3 & 0xfffff) << 0xd | uVar13 & 0xfffffeae000011ff) <<
                                bVar6 | (ulong)((uint)uVar11 & ~(-1 << bVar6))) >>
                              ((byte)lVar8 & 0x3f));
              pbVar9 = pbVar9 + 1;
            }
          }
        }
        uVar12 = uVar12 + 0x29;
      }
      pBVar10 = pBVar10 + 0x10;
    }
  }
  return SVar5;
}

Assistant:

SizeT IA64_Convert(Byte *data, SizeT size, UInt32 ip, int encoding)
{
  SizeT i;
  if (size < 16)
    return 0;
  size -= 16;
  for (i = 0; i <= size; i += 16)
  {
    UInt32 instrTemplate = data[i] & 0x1F;
    UInt32 mask = kBranchTable[instrTemplate];
    UInt32 bitPos = 5;
    int slot;
    for (slot = 0; slot < 3; slot++, bitPos += 41)
    {
      UInt32 bytePos, bitRes;
      UInt64 instruction, instNorm;
      int j;
      if (((mask >> slot) & 1) == 0)
        continue;
      bytePos = (bitPos >> 3);
      bitRes = bitPos & 0x7;
      instruction = 0;
      for (j = 0; j < 6; j++)
        instruction += (UInt64)data[i + j + bytePos] << (8 * j);

      instNorm = instruction >> bitRes;
      if (((instNorm >> 37) & 0xF) == 0x5 && ((instNorm >> 9) & 0x7) == 0)
      {
        UInt32 src = (UInt32)((instNorm >> 13) & 0xFFFFF);
        UInt32 dest;
        src |= ((UInt32)(instNorm >> 36) & 1) << 20;
        
        src <<= 4;
        
        if (encoding)
          dest = ip + (UInt32)i + src;
        else
          dest = src - (ip + (UInt32)i);
        
        dest >>= 4;
        
        instNorm &= ~((UInt64)(0x8FFFFF) << 13);
        instNorm |= ((UInt64)(dest & 0xFFFFF) << 13);
        instNorm |= ((UInt64)(dest & 0x100000) << (36 - 20));
        
        instruction &= (1 << bitRes) - 1;
        instruction |= (instNorm << bitRes);
        for (j = 0; j < 6; j++)
          data[i + j + bytePos] = (Byte)(instruction >> (8 * j));
      }
    }
  }
  return i;
}